

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O2

void copy_objects_undo_proc(Am_Object *command_obj)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object *this;
  Am_Object selection_widget;
  Am_Value_List copied_objs;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Value_List local_40;
  Am_Object local_30;
  Am_Value_List local_28;
  
  local_50.data = (Am_Object_Data *)0x0;
  Am_Value_List::Am_Value_List(&local_40);
  Am_Object::Am_Object(&local_60,command_obj);
  Am_Get_Selection_Widget_For_Command(&local_58);
  Am_Object::operator=(&local_50,&local_58);
  Am_Object::~Am_Object(&local_58);
  Am_Object::~Am_Object(&local_60);
  pAVar2 = Am_Object::Get(command_obj,0x16d,0);
  Am_Value_List::operator=(&local_40,pAVar2);
  pAVar2 = Am_Object::Get(command_obj,0x16f,0);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar2);
  if (bVar1) {
    Am_Object::Am_Object(&local_48,command_obj);
    Am_Value_List::Am_Value_List(&local_28,&local_40);
    this = &local_48;
    copy_objects_into_clipboard(this,&local_28);
    Am_Value_List::~Am_Value_List(&local_28);
  }
  else {
    this = &local_30;
    Am_Object::Am_Object(this,command_obj);
    restore_old_clipboard_objs(this);
  }
  Am_Object::~Am_Object(this);
  Am_Object::Set(command_obj,0x16f,!bVar1,0);
  Am_Value_List::~Am_Value_List(&local_40);
  Am_Object::~Am_Object(&local_50);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, copy_objects_undo,
                 (Am_Object command_obj))
{
  Am_Object selection_widget;
  Am_Value_List copied_objs;
  selection_widget = Am_Get_Selection_Widget_For_Command(command_obj);
  copied_objs = command_obj.Get(Am_OBJECT_MODIFIED);
  bool currently_undone = command_obj.Get(Am_HAS_BEEN_UNDONE);

  if (currently_undone) { // then redo = reset the clipboard
    copy_objects_into_clipboard(command_obj, copied_objs);
  } else // restore clipboard
    restore_old_clipboard_objs(command_obj);
  command_obj.Set(Am_HAS_BEEN_UNDONE, !currently_undone);
}